

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O2

Expression *
slang::ast::Expression::bindAssignmentPattern
          (Compilation *comp,AssignmentPatternExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  SyntaxKind SVar1;
  SymbolKind SVar2;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  bool bVar3;
  bitwidth_t bVar4;
  Type *this;
  PackedArrayType *pPVar5;
  FixedSizeUnpackedArrayType *pFVar6;
  PackedStructType *pPVar7;
  UnpackedStructType *pUVar8;
  SyntaxNode *this_00;
  SimpleAssignmentPatternSyntax *pSVar9;
  StructuredAssignmentPatternSyntax *pSVar10;
  ReplicatedAssignmentPatternSyntax *pRVar11;
  Compilation *pCVar12;
  Diagnostic *diag;
  Expression *pEVar13;
  logic_error *plVar14;
  int iVar15;
  DiagCode code;
  int iVar16;
  Scope *structScope;
  SourceRange sourceRange_01;
  SourceLocation in_stack_fffffffffffffe48;
  Type *local_1b0;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  SourceRange local_d0;
  SourceRange local_c0;
  SourceRange local_b0;
  SourceRange local_a0;
  SourceRange local_90;
  SourceRange local_80;
  SourceRange local_70;
  SourceRange local_60;
  SourceRange local_50;
  SourceRange local_40;
  
  sourceRange_01 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  if (syntax->type == (DataTypeSyntax *)0x0) {
    if (assignmentTarget != (Type *)0x0) goto LAB_00309150;
    sourceRange_01 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    code.subsystem = Expressions;
    code.code = 0x14;
    goto LAB_003091c0;
  }
  assignmentTarget = Compilation::getType(comp,syntax->type,context,(Type *)0x0);
  bVar3 = Type::isSimpleType(assignmentTarget);
  if ((!bVar3) && ((syntax->type->super_ExpressionSyntax).super_SyntaxNode.kind != TypeReference)) {
    bVar3 = Type::isError(assignmentTarget);
    if (bVar3) goto LAB_003094e6;
LAB_003094d3:
    diag = ASTContext::addDiag(context,(DiagCode)0x1c0007,sourceRange_01);
    ast::operator<<(diag,assignmentTarget);
    goto LAB_003094e6;
  }
LAB_00309150:
  bVar3 = Type::isError(assignmentTarget);
  if (bVar3) goto LAB_003094e6;
  this = Type::getCanonicalType(assignmentTarget);
  switch((this->super_Symbol).kind) {
  case PackedArrayType:
    pPVar5 = Symbol::as<slang::ast::PackedArrayType>(&this->super_Symbol);
    local_1b0 = pPVar5->elementType;
    iVar15 = (pPVar5->range).left - (pPVar5->range).right;
    goto LAB_003091fa;
  case FixedSizeUnpackedArrayType:
    pFVar6 = Symbol::as<slang::ast::FixedSizeUnpackedArrayType>(&this->super_Symbol);
    local_1b0 = pFVar6->elementType;
    iVar15 = (pFVar6->range).left - (pFVar6->range).right;
LAB_003091fa:
    iVar16 = -iVar15;
    if (0 < iVar15) {
      iVar16 = iVar15;
    }
    bVar4 = iVar16 + 1;
    break;
  case DynamicArrayType:
  case AssociativeArrayType:
  case QueueType:
    local_1b0 = Type::getArrayElementType(this);
    bVar4 = 0;
    break;
  case PackedStructType:
    pPVar7 = Symbol::as<slang::ast::PackedStructType>(&this->super_Symbol);
    structScope = &pPVar7->super_Scope;
    goto LAB_0030926c;
  case UnpackedStructType:
    pUVar8 = Symbol::as<slang::ast::UnpackedStructType>(&this->super_Symbol);
    structScope = &pUVar8->super_Scope;
LAB_0030926c:
    bVar4 = 0;
    local_1b0 = (Type *)0x0;
    goto LAB_00309278;
  default:
    bVar3 = Type::isIntegral(this);
    if ((!bVar3) || ((this->super_Symbol).kind == ScalarType)) goto LAB_003094d3;
    bVar3 = Type::isFourState(this);
    local_1b0 = comp->scalarTypeTable[(ulong)bVar3 + 8];
    bVar4 = Type::getBitWidth(this);
  }
  structScope = (Scope *)0x0;
LAB_00309278:
  this_00 = &not_null<slang::syntax::AssignmentPatternSyntax_*>::get(&syntax->pattern)->
             super_SyntaxNode;
  if (structScope == (Scope *)0x0) {
    SVar2 = (this->super_Symbol).kind;
    if (SVar2 != QueueType) {
      if (SVar2 == AssociativeArrayType) {
        SVar1 = this_00->kind;
        if (SVar1 != ReplicatedAssignmentPattern) {
          if (SVar1 == StructuredAssignmentPattern) {
            pSVar10 = slang::syntax::SyntaxNode::
                      as<slang::syntax::StructuredAssignmentPatternSyntax>(this_00);
            local_a0 = sourceRange_01;
            pEVar13 = StructuredAssignmentPatternExpression::forAssociativeArray
                                (comp,pSVar10,context,assignmentTarget,local_1b0,sourceRange_01);
            return pEVar13;
          }
          if (SVar1 != SimpleAssignmentPattern) {
            plVar14 = (logic_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_170,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssignmentExpressions.cpp"
                       ,(allocator<char> *)&stack0xfffffffffffffe4f);
            std::operator+(&local_150,&local_170,":");
            std::__cxx11::to_string(&local_190,0x479);
            std::operator+(&local_130,&local_150,&local_190);
            std::operator+(&local_110,&local_130,": ");
            std::operator+(&local_f0,&local_110,"Default case should be unreachable!");
            std::logic_error::logic_error(plVar14,(string *)&local_f0);
            __cxa_throw(plVar14,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
        }
        code.subsystem = Expressions;
        code.code = 0xc;
LAB_003091c0:
        ASTContext::addDiag(context,code,sourceRange_01);
LAB_003094e6:
        pEVar13 = badExpr(comp,(Expression *)0x0);
        return pEVar13;
      }
      if (SVar2 != DynamicArrayType) {
        SVar1 = this_00->kind;
        if (SVar1 == ReplicatedAssignmentPattern) {
          pCVar12 = (Compilation *)
                    slang::syntax::SyntaxNode::as<slang::syntax::ReplicatedAssignmentPatternSyntax>
                              (this_00);
          sourceRange_00.endLoc = in_stack_fffffffffffffe48;
          sourceRange_00.startLoc = sourceRange_01.endLoc;
          local_d0 = sourceRange_01;
          pEVar13 = ReplicatedAssignmentPatternExpression::forFixedArray
                              ((ReplicatedAssignmentPatternExpression *)comp,pCVar12,
                               (ReplicatedAssignmentPatternSyntax *)context,
                               (ASTContext *)assignmentTarget,local_1b0,(Type *)(ulong)bVar4,
                               sourceRange_01.startLoc._0_4_,sourceRange_00);
          return pEVar13;
        }
        if (SVar1 != StructuredAssignmentPattern) {
          if (SVar1 == SimpleAssignmentPattern) {
            pCVar12 = (Compilation *)
                      slang::syntax::SyntaxNode::as<slang::syntax::SimpleAssignmentPatternSyntax>
                                (this_00);
            sourceRange.endLoc = in_stack_fffffffffffffe48;
            sourceRange.startLoc = sourceRange_01.endLoc;
            local_b0 = sourceRange_01;
            pEVar13 = SimpleAssignmentPatternExpression::forFixedArray
                                ((SimpleAssignmentPatternExpression *)comp,pCVar12,
                                 (SimpleAssignmentPatternSyntax *)context,
                                 (ASTContext *)assignmentTarget,local_1b0,(Type *)(ulong)bVar4,
                                 sourceRange_01.startLoc._0_4_,sourceRange);
            return pEVar13;
          }
          plVar14 = (logic_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_170,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssignmentExpressions.cpp"
                     ,(allocator<char> *)&stack0xfffffffffffffe4f);
          std::operator+(&local_150,&local_170,":");
          std::__cxx11::to_string(&local_190,0x48b);
          std::operator+(&local_130,&local_150,&local_190);
          std::operator+(&local_110,&local_130,": ");
          std::operator+(&local_f0,&local_110,"Default case should be unreachable!");
          std::logic_error::logic_error(plVar14,(string *)&local_f0);
          __cxa_throw(plVar14,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        pSVar10 = slang::syntax::SyntaxNode::as<slang::syntax::StructuredAssignmentPatternSyntax>
                            (this_00);
        local_c0 = sourceRange_01;
        pEVar13 = StructuredAssignmentPatternExpression::forFixedArray
                            (comp,pSVar10,context,assignmentTarget,local_1b0,sourceRange_01);
        return pEVar13;
      }
    }
    SVar1 = this_00->kind;
    if (SVar1 == ReplicatedAssignmentPattern) {
      pRVar11 = slang::syntax::SyntaxNode::as<slang::syntax::ReplicatedAssignmentPatternSyntax>
                          (this_00);
      local_90 = sourceRange_01;
      pEVar13 = ReplicatedAssignmentPatternExpression::forDynamicArray
                          (comp,pRVar11,context,assignmentTarget,local_1b0,sourceRange_01);
    }
    else if (SVar1 == StructuredAssignmentPattern) {
      pSVar10 = slang::syntax::SyntaxNode::as<slang::syntax::StructuredAssignmentPatternSyntax>
                          (this_00);
      local_80 = sourceRange_01;
      pEVar13 = StructuredAssignmentPatternExpression::forDynamicArray
                          (comp,pSVar10,context,assignmentTarget,local_1b0,sourceRange_01);
    }
    else {
      if (SVar1 != SimpleAssignmentPattern) {
        plVar14 = (logic_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_170,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssignmentExpressions.cpp"
                   ,(allocator<char> *)&stack0xfffffffffffffe4f);
        std::operator+(&local_150,&local_170,":");
        std::__cxx11::to_string(&local_190,0x46b);
        std::operator+(&local_130,&local_150,&local_190);
        std::operator+(&local_110,&local_130,": ");
        std::operator+(&local_f0,&local_110,"Default case should be unreachable!");
        std::logic_error::logic_error(plVar14,(string *)&local_f0);
        __cxa_throw(plVar14,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      pSVar9 = slang::syntax::SyntaxNode::as<slang::syntax::SimpleAssignmentPatternSyntax>(this_00);
      local_70 = sourceRange_01;
      pEVar13 = SimpleAssignmentPatternExpression::forDynamicArray
                          (comp,pSVar9,context,assignmentTarget,local_1b0,sourceRange_01);
    }
  }
  else {
    SVar1 = this_00->kind;
    if (SVar1 == ReplicatedAssignmentPattern) {
      pRVar11 = slang::syntax::SyntaxNode::as<slang::syntax::ReplicatedAssignmentPatternSyntax>
                          (this_00);
      local_60 = sourceRange_01;
      pEVar13 = ReplicatedAssignmentPatternExpression::forStruct
                          (comp,pRVar11,context,assignmentTarget,structScope,sourceRange_01);
    }
    else if (SVar1 == StructuredAssignmentPattern) {
      pSVar10 = slang::syntax::SyntaxNode::as<slang::syntax::StructuredAssignmentPatternSyntax>
                          (this_00);
      local_50 = sourceRange_01;
      pEVar13 = StructuredAssignmentPatternExpression::forStruct
                          (comp,pSVar10,context,assignmentTarget,structScope,sourceRange_01);
    }
    else {
      if (SVar1 != SimpleAssignmentPattern) {
        plVar14 = (logic_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_170,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssignmentExpressions.cpp"
                   ,(allocator<char> *)&stack0xfffffffffffffe4f);
        std::operator+(&local_150,&local_170,":");
        std::__cxx11::to_string(&local_190,0x459);
        std::operator+(&local_130,&local_150,&local_190);
        std::operator+(&local_110,&local_130,": ");
        std::operator+(&local_f0,&local_110,"Default case should be unreachable!");
        std::logic_error::logic_error(plVar14,(string *)&local_f0);
        __cxa_throw(plVar14,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      pSVar9 = slang::syntax::SyntaxNode::as<slang::syntax::SimpleAssignmentPatternSyntax>(this_00);
      local_40 = sourceRange_01;
      pEVar13 = SimpleAssignmentPatternExpression::forStruct
                          (comp,pSVar9,context,assignmentTarget,structScope,sourceRange_01);
    }
  }
  return pEVar13;
}

Assistant:

Expression& Expression::bindAssignmentPattern(Compilation& comp,
                                              const AssignmentPatternExpressionSyntax& syntax,
                                              const ASTContext& context,
                                              const Type* assignmentTarget) {
    SourceRange range = syntax.sourceRange();

    if (syntax.type) {
        assignmentTarget = &comp.getType(*syntax.type, context);
        if (!assignmentTarget->isSimpleType() && syntax.type->kind != SyntaxKind::TypeReference) {
            if (!assignmentTarget->isError())
                context.addDiag(diag::BadAssignmentPatternType, range) << *assignmentTarget;
            return badExpr(comp, nullptr);
        }
    }

    if (!assignmentTarget || assignmentTarget->isError()) {
        if (!assignmentTarget)
            context.addDiag(diag::AssignmentPatternNoContext, syntax.sourceRange());
        return badExpr(comp, nullptr);
    }

    const Type& type = *assignmentTarget;
    const Scope* structScope = nullptr;
    const Type* elementType = nullptr;
    bitwidth_t numElements = 0;

    auto& ct = type.getCanonicalType();
    if (ct.kind == SymbolKind::PackedStructType) {
        structScope = &ct.as<PackedStructType>();
    }
    else if (ct.kind == SymbolKind::UnpackedStructType) {
        structScope = &ct.as<UnpackedStructType>();
    }
    else if (ct.kind == SymbolKind::PackedArrayType) {
        auto& ua = ct.as<PackedArrayType>();
        elementType = &ua.elementType;
        numElements = ua.range.width();
    }
    else if (ct.kind == SymbolKind::FixedSizeUnpackedArrayType) {
        auto& ua = ct.as<FixedSizeUnpackedArrayType>();
        elementType = &ua.elementType;
        numElements = ua.range.width();
    }
    else if (ct.kind == SymbolKind::DynamicArrayType ||
             ct.kind == SymbolKind::AssociativeArrayType || ct.kind == SymbolKind::QueueType) {
        elementType = ct.getArrayElementType();
    }
    else if (ct.isIntegral() && ct.kind != SymbolKind::ScalarType) {
        elementType = ct.isFourState() ? &comp.getLogicType() : &comp.getBitType();
        numElements = ct.getBitWidth();
    }
    else {
        context.addDiag(diag::BadAssignmentPatternType, range) << type;
        return badExpr(comp, nullptr);
    }

    const AssignmentPatternSyntax& p = *syntax.pattern;
    if (structScope) {
        switch (p.kind) {
            case SyntaxKind::SimpleAssignmentPattern:
                return SimpleAssignmentPatternExpression::forStruct(
                    comp, p.as<SimpleAssignmentPatternSyntax>(), context, type, *structScope,
                    range);
            case SyntaxKind::StructuredAssignmentPattern:
                return StructuredAssignmentPatternExpression::forStruct(
                    comp, p.as<StructuredAssignmentPatternSyntax>(), context, type, *structScope,
                    range);
            case SyntaxKind::ReplicatedAssignmentPattern:
                return ReplicatedAssignmentPatternExpression::forStruct(
                    comp, p.as<ReplicatedAssignmentPatternSyntax>(), context, type, *structScope,
                    range);
            default:
                ASSUME_UNREACHABLE;
        }
    }
    else if (ct.kind == SymbolKind::DynamicArrayType || ct.kind == SymbolKind::QueueType) {
        switch (p.kind) {
            case SyntaxKind::SimpleAssignmentPattern:
                return SimpleAssignmentPatternExpression::forDynamicArray(
                    comp, p.as<SimpleAssignmentPatternSyntax>(), context, type, *elementType,
                    range);
            case SyntaxKind::StructuredAssignmentPattern:
                return StructuredAssignmentPatternExpression::forDynamicArray(
                    comp, p.as<StructuredAssignmentPatternSyntax>(), context, type, *elementType,
                    range);
            case SyntaxKind::ReplicatedAssignmentPattern:
                return ReplicatedAssignmentPatternExpression::forDynamicArray(
                    comp, p.as<ReplicatedAssignmentPatternSyntax>(), context, type, *elementType,
                    range);
            default:
                ASSUME_UNREACHABLE;
        }
    }
    else if (ct.kind == SymbolKind::AssociativeArrayType) {
        switch (p.kind) {
            case SyntaxKind::SimpleAssignmentPattern:
            case SyntaxKind::ReplicatedAssignmentPattern:
                context.addDiag(diag::AssignmentPatternAssociativeType, range);
                return badExpr(comp, nullptr);
            case SyntaxKind::StructuredAssignmentPattern:
                return StructuredAssignmentPatternExpression::forAssociativeArray(
                    comp, p.as<StructuredAssignmentPatternSyntax>(), context, type, *elementType,
                    range);
            default:
                ASSUME_UNREACHABLE;
        }
    }
    else {
        switch (p.kind) {
            case SyntaxKind::SimpleAssignmentPattern:
                return SimpleAssignmentPatternExpression::forFixedArray(
                    comp, p.as<SimpleAssignmentPatternSyntax>(), context, type, *elementType,
                    numElements, range);
            case SyntaxKind::StructuredAssignmentPattern:
                return StructuredAssignmentPatternExpression::forFixedArray(
                    comp, p.as<StructuredAssignmentPatternSyntax>(), context, type, *elementType,
                    range);
            case SyntaxKind::ReplicatedAssignmentPattern:
                return ReplicatedAssignmentPatternExpression::forFixedArray(
                    comp, p.as<ReplicatedAssignmentPatternSyntax>(), context, type, *elementType,
                    numElements, range);
            default:
                ASSUME_UNREACHABLE;
        }
    }
}